

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# importer.cpp
# Opt level: O1

bool __thiscall
libcellml::Importer::ImporterImpl::checkForImportCycles
          (ImporterImpl *this,ImportSourcePtr *importSource,History *history,HistoryEpochPtr *h,
          string *action)

{
  bool bVar1;
  IssuePtr issue;
  string description;
  History cyclicHistory;
  IssuePtr local_80;
  ImportSourcePtr *local_70;
  string local_68;
  vector<std::shared_ptr<libcellml::HistoryEpoch>,_std::allocator<std::shared_ptr<libcellml::HistoryEpoch>_>_>
  local_48;
  
  local_70 = importSource;
  bVar1 = libcellml::checkForImportCycles(history,h);
  if (bVar1) {
    std::
    vector<std::shared_ptr<libcellml::HistoryEpoch>,_std::allocator<std::shared_ptr<libcellml::HistoryEpoch>_>_>
    ::vector(&local_48,history);
    std::
    vector<std::shared_ptr<libcellml::HistoryEpoch>,_std::allocator<std::shared_ptr<libcellml::HistoryEpoch>_>_>
    ::push_back(&local_48,h);
    formDescriptionOfCyclicDependency(&local_68,&local_48,action);
    Issue::IssueImpl::create();
    Issue::IssueImpl::setDescription
              ((local_80.super___shared_ptr<libcellml::Issue,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
               mPimpl,&local_68);
    AnyCellmlElement::AnyCellmlElementImpl::setImportSource
              ((((local_80.super___shared_ptr<libcellml::Issue,_(__gnu_cxx::_Lock_policy)2>._M_ptr)
                 ->mPimpl->mItem).
                super___shared_ptr<libcellml::AnyCellmlElement,_(__gnu_cxx::_Lock_policy)2>._M_ptr)
               ->mPimpl,local_70);
    Issue::IssueImpl::setReferenceRule
              ((local_80.super___shared_ptr<libcellml::Issue,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
               mPimpl,IMPORT_EQUIVALENT_INFOSET);
    Logger::LoggerImpl::addIssue(&this->super_LoggerImpl,&local_80);
    if (local_80.super___shared_ptr<libcellml::Issue,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
        != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                (local_80.super___shared_ptr<libcellml::Issue,_(__gnu_cxx::_Lock_policy)2>.
                 _M_refcount._M_pi);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_68._M_dataplus._M_p != &local_68.field_2) {
      operator_delete(local_68._M_dataplus._M_p,local_68.field_2._M_allocated_capacity + 1);
    }
    std::
    vector<std::shared_ptr<libcellml::HistoryEpoch>,_std::allocator<std::shared_ptr<libcellml::HistoryEpoch>_>_>
    ::~vector(&local_48);
  }
  return bVar1;
}

Assistant:

bool Importer::ImporterImpl::checkForImportCycles(const ImportSourcePtr &importSource, const History &history, const HistoryEpochPtr &h, const std::string &action)
{
    if (libcellml::checkForImportCycles(history, h)) {
        auto cyclicHistory = history;
        cyclicHistory.push_back(h);
        auto description = formDescriptionOfCyclicDependency(cyclicHistory, action);
        auto issue = Issue::IssueImpl::create();
        issue->mPimpl->setDescription(description);
        issue->mPimpl->mItem->mPimpl->setImportSource(importSource);
        issue->mPimpl->setReferenceRule(Issue::ReferenceRule::IMPORT_EQUIVALENT_INFOSET);
        addIssue(issue);
        return true;
    }

    return false;
}